

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

ObjectUnit * create_objunit(GlobalVars *gv,LinkFile *lf,char *objname)

{
  ObjectUnit *pOVar1;
  char *pcVar2;
  Symbol **ppSVar3;
  
  pOVar1 = (ObjectUnit *)alloc(0x88);
  pOVar1->lnkfile = lf;
  pcVar2 = "";
  if (objname != (char *)0x0) {
    pcVar2 = objname;
  }
  pOVar1->objname = pcVar2;
  initlist(&pOVar1->sections);
  pOVar1->common = (Section *)0x0;
  pOVar1->scommon = (Section *)0x0;
  ppSVar3 = (Symbol **)alloc_hashtable(0x20);
  pOVar1->objsyms = ppSVar3;
  initlist(&pOVar1->stabs);
  initlist(&pOVar1->pripointers);
  pOVar1->flags = 0;
  pOVar1->min_alignment = gv->min_alignment;
  return pOVar1;
}

Assistant:

struct ObjectUnit *create_objunit(struct GlobalVars *gv,
                                  struct LinkFile *lf,const char *objname)
/* creates and initializes an ObjectUnit node */
{
  struct ObjectUnit *ou = alloc(sizeof(struct ObjectUnit));

  ou->lnkfile = lf;
  if (objname)
    ou->objname = objname;
  else
    ou->objname = noname;
  initlist(&ou->sections);  /* empty section list */
  ou->common = ou->scommon = NULL;
  ou->objsyms = alloc_hashtable(OBJSYMHTABSIZE);
  initlist(&ou->stabs);  /* empty stabs list */
  initlist(&ou->pripointers);  /* empty PriPointer list */
  ou->flags = 0;
  ou->min_alignment = gv->min_alignment;
  return ou;
}